

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_unsigned_integer.h
# Opt level: O1

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,unsigned_short,4u,4u,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::optional_t<date::character_t<char>,date::fraction_t<unsigned_int,9u>>&,date::cases_t<date::branch_t<date::character_t<char>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::character_t<char>,date::unsigned_integer_t<short,2u,2u>>>&>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               unsigned_integer_t<unsigned_short,_4U,_4U> *fmt,character_t<char> *others,
               unsigned_integer_t<unsigned_char,_2U,_2U> *others_1,character_t<char> *others_2,
               unsigned_integer_t<unsigned_char,_2U,_2U> *others_3,character_t<char> *others_4,
               unsigned_integer_t<unsigned_char,_2U,_2U> *others_5,character_t<char> *others_6,
               unsigned_integer_t<unsigned_char,_2U,_2U> *others_7,character_t<char> *others_8,
               unsigned_integer_t<unsigned_char,_2U,_2U> *others_9,
               optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_> *others_10,
               cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
               *others_11)

{
  bool bVar1;
  value_type_conflict2 vVar2;
  ulong uVar3;
  
  vVar2 = 0;
  uVar3 = 0;
  while (((uVar3 < 4 && (end->m_position != pos->m_position)) &&
         ((byte)(pos->m_cache[pos->m_position] - 0x30U) < 10))) {
    vVar2 = ((byte)pos->m_cache[pos->m_position] & 0xf) + vVar2 * 10;
    uVar3 = uVar3 + 1;
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(pos);
  }
  if (uVar3 < 4) {
    bVar1 = false;
  }
  else {
    *fmt->value = vVar2;
    bVar1 = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::optional_t<date::character_t<char>,date::fraction_t<unsigned_int,9u>>&,date::cases_t<date::branch_t<date::character_t<char>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::character_t<char>,date::unsigned_integer_t<short,2u,2u>>>&>
                      (pos,end,others,others_1,others_2,others_3,others_4,others_5,others_6,others_7
                       ,others_8,others_9,others_10,others_11);
  }
  return bVar1;
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, unsigned_integer_t<UnsignedInt, MinLength, MaxLength>& fmt, Others&&... others)
{
    using char_type  = typename iterator_traits<Iterator>::value_type;

    auto x = UnsignedInt{ 0 };
    auto count = std::size_t{ 0 };
    while (count < MaxLength)
    {
        if (pos == end)
            break;

        const char_type ch = *pos;
        if ((ch < char_type{ '0' }) || (ch > char_type{ '9' }))
            break;

        x = 10 * x + static_cast<UnsignedInt>(ch - char_type{ '0' });
        ++count;
        ++pos;
    }

    if (count < MinLength)
        return false;

    fmt.value = x;
    return read_impl(pos, end, std::forward<Others>(others)...);
}